

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::unquantizeWeights
               (deUint32 *dst,ISEDecodedResult *weightGrid,ASTCBlockMode *blockMode)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  uint uVar5;
  deUint32 dVar6;
  ISEParams *pIVar7;
  deUint32 *pdVar8;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int weightNdx_3;
  int weightNdx_2;
  int weightNdx_1;
  deUint32 B;
  deUint32 A;
  deUint32 c;
  deUint32 b;
  deUint32 a;
  int weightNdx;
  deUint32 C;
  int i;
  deUint32 *map;
  int rangeCase;
  ISEParams *iseParams;
  int numWeights;
  ASTCBlockMode *blockMode_local;
  ISEDecodedResult *weightGrid_local;
  deUint32 *dst_local;
  
  local_6c = computeNumWeights(blockMode);
  pIVar7 = &blockMode->weightISEParams;
  if ((pIVar7->mode == ISEMODE_TRIT) || (pIVar7->mode == ISEMODE_QUINT)) {
    iVar1 = (blockMode->weightISEParams).numBits * 2 + (uint)(pIVar7->mode == ISEMODE_QUINT);
    if ((iVar1 == 0) || (iVar1 == 1)) {
      pdVar8 = unquantizeWeights::map1;
      if (iVar1 == 0) {
        pdVar8 = unquantizeWeights::map0;
      }
      for (weightNdx = 0; weightNdx < local_6c; weightNdx = weightNdx + 1) {
        dst[weightNdx] = pdVar8[weightGrid[weightNdx].v];
      }
    }
    else {
      dVar6 = unquantizeWeights::Ca[iVar1 + -2];
      for (b = 0; (int)b < local_6c; b = b + 1) {
        dVar2 = getBit(weightGrid[(int)b].m,0);
        dVar3 = getBit(weightGrid[(int)b].m,1);
        dVar4 = getBit(weightGrid[(int)b].m,2);
        uVar5 = 0x7f;
        if (dVar2 == 0) {
          uVar5 = 0;
        }
        if (iVar1 == 2) {
          local_70 = 0;
        }
        else {
          if (iVar1 == 3) {
            local_74 = 0;
          }
          else {
            if (iVar1 == 4) {
              local_78 = dVar3 << 6 | dVar3 << 2 | dVar3;
            }
            else {
              if (iVar1 == 5) {
                local_7c = dVar3 << 6 | dVar3 << 1;
              }
              else {
                if (iVar1 == 6) {
                  local_80 = dVar4 << 6 | dVar3 << 5 | dVar4 << 1 | dVar3;
                }
                else {
                  local_80 = 0xffffffff;
                }
                local_7c = local_80;
              }
              local_78 = local_7c;
            }
            local_74 = local_78;
          }
          local_70 = local_74;
        }
        dst[(int)b] = (weightGrid[(int)b].tq * dVar6 + local_70 ^ uVar5) >> 2 | uVar5 & 0x20;
      }
    }
  }
  else {
    for (weightNdx_3 = 0; weightNdx_3 < local_6c; weightNdx_3 = weightNdx_3 + 1) {
      dVar6 = bitReplicationScale(weightGrid[weightNdx_3].v,(blockMode->weightISEParams).numBits,6);
      dst[weightNdx_3] = dVar6;
    }
  }
  for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
    dst[local_68] = (uint)(0x20 < dst[local_68]) + dst[local_68];
  }
  for (; local_6c < 0x40; local_6c = local_6c + 1) {
    dst[local_6c] = 0xffffffff;
  }
  return;
}

Assistant:

void unquantizeWeights (deUint32 dst[64], const ISEDecodedResult* weightGrid, const ASTCBlockMode& blockMode)
{
	const int			numWeights	= computeNumWeights(blockMode);
	const ISEParams&	iseParams	= blockMode.weightISEParams;

	if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
	{
		const int rangeCase = iseParams.numBits*2 + (iseParams.mode == ISEMODE_QUINT ? 1 : 0);

		if (rangeCase == 0 || rangeCase == 1)
		{
			static const deUint32 map0[3]	= { 0, 32, 63 };
			static const deUint32 map1[5]	= { 0, 16, 32, 47, 63 };
			const deUint32* const map		= rangeCase == 0 ? &map0[0] : &map1[0];
			for (int i = 0; i < numWeights; i++)
			{
				DE_ASSERT(weightGrid[i].v < (rangeCase == 0 ? 3u : 5u));
				dst[i] = map[weightGrid[i].v];
			}
		}
		else
		{
			DE_ASSERT(rangeCase <= 6);
			static const deUint32	Ca[5]	= { 50, 28, 23, 13, 11 };
			const deUint32			C		= Ca[rangeCase-2];

			for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
			{
				const deUint32 a = getBit(weightGrid[weightNdx].m, 0);
				const deUint32 b = getBit(weightGrid[weightNdx].m, 1);
				const deUint32 c = getBit(weightGrid[weightNdx].m, 2);

				const deUint32 A = a == 0 ? 0 : (1<<7)-1;
				const deUint32 B = rangeCase == 2 ? 0
								 : rangeCase == 3 ? 0
								 : rangeCase == 4 ? (b << 6) |					(b << 2) |				(b << 0)
								 : rangeCase == 5 ? (b << 6) |								(b << 1)
								 : rangeCase == 6 ? (c << 6) | (b << 5) |					(c << 1) |	(b << 0)
								 : (deUint32)-1;

				dst[weightNdx] = (((weightGrid[weightNdx].tq*C + B) ^ A) >> 2) | (A & 0x20);
			}
		}
	}
	else
	{
		DE_ASSERT(iseParams.mode == ISEMODE_PLAIN_BIT);

		for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
			dst[weightNdx] = bitReplicationScale(weightGrid[weightNdx].v, iseParams.numBits, 6);
	}

	for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
		dst[weightNdx] += dst[weightNdx] > 32 ? 1 : 0;

	// Initialize nonexistent weights to poison values
	for (int weightNdx = numWeights; weightNdx < 64; weightNdx++)
		dst[weightNdx] = ~0u;

}